

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgclient.c
# Opt level: O0

int mg_session_run(mg_session *session,char *query,mg_map *params,mg_map *extra_run_information,
                  mg_list **columns,int64_t *qid)

{
  int iVar1;
  mg_value_type mVar2;
  int iVar3;
  mg_value *pmVar4;
  mg_list *pmVar5;
  int64_t iVar6;
  mg_session *in_RDI;
  mg_session *in_R8;
  mg_session *in_R9;
  int failure_status;
  mg_value *qid_tmp;
  mg_value *columns_tmp;
  mg_message *response;
  int status;
  mg_allocator *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  mg_session *in_stack_ffffffffffffffa8;
  mg_map *in_stack_ffffffffffffffb0;
  mg_map *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  
  if (in_RDI->status == 2) {
    mg_session_set_error(in_RDI,"bad session");
    return -0xf;
  }
  if ((in_RDI->explicit_transaction == 0) && (in_RDI->status == 1)) {
    mg_session_set_error(in_RDI,"already executing a query");
    return -0xf;
  }
  if (in_RDI->status == 3) {
    mg_session_set_error(in_RDI,"fetching results of a query");
    return -0xf;
  }
  mg_message_destroy_ca
            ((mg_message *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  (in_RDI->result).message = (mg_message *)0x0;
  mg_list_destroy_ca((mg_list *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
  (in_RDI->result).columns = (mg_list *)0x0;
  iVar1 = mg_session_send_run_message
                    (in_R9,(char *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     in_stack_ffffffffffffffb0);
  if (iVar1 == 0) {
    mg_transport_suspend_until_ready_to_read((mg_transport *)0x106226);
    iVar1 = mg_session_receive_message
                      ((mg_session *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if ((iVar1 == 0) &&
       (iVar1 = mg_session_read_bolt_message(in_R9,(mg_message **)(ulong)in_stack_ffffffffffffffc0),
       iVar1 == 0)) {
      if (in_stack_ffffffffffffffb8->size == 1) {
        pmVar4 = mg_map_at((mg_map *)in_stack_ffffffffffffffa8,
                           (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        if ((pmVar4 != (mg_value *)0x0) &&
           (mVar2 = mg_value_get_type(pmVar4), mVar2 == MG_VALUE_TYPE_LIST)) {
          mg_value_list(pmVar4);
          pmVar5 = mg_list_copy_ca((mg_list *)in_stack_ffffffffffffffa8,
                                   (mg_allocator *)
                                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
          (in_RDI->result).columns = pmVar5;
          mg_message_destroy_ca
                    ((mg_message *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
          if ((in_RDI->result).columns == (mg_list *)0x0) {
            mg_session_set_error(in_RDI,"out of memory");
            return -3;
          }
          if ((in_RDI->version == 4) && (in_RDI->explicit_transaction != 0)) {
            if (in_R9 != (mg_session *)0x0) {
              pmVar4 = mg_map_at((mg_map *)in_stack_ffffffffffffffa8,
                                 (char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                  in_stack_ffffffffffffffa0));
              if ((pmVar4 == (mg_value *)0x0) ||
                 (mVar2 = mg_value_get_type(pmVar4), mVar2 != MG_VALUE_TYPE_INTEGER)) {
                iVar1 = -10;
                mg_message_destroy_ca
                          ((mg_message *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98);
                mg_session_set_error(in_RDI,"invalid response metadata");
                goto LAB_001064b0;
              }
              iVar6 = mg_value_integer(pmVar4);
              in_R9->status = (int)iVar6;
              in_R9->explicit_transaction = (int)((ulong)iVar6 >> 0x20);
            }
            in_RDI->query_number = in_RDI->query_number + 1;
          }
          if (in_R8 != (mg_session *)0x0) {
            *(mg_list **)in_R8 = (in_RDI->result).columns;
          }
          in_RDI->status = 1;
          return 0;
        }
        iVar1 = -10;
        mg_message_destroy_ca
                  ((mg_message *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98);
        mg_session_set_error(in_RDI,"invalid response metadata");
      }
      else if (in_stack_ffffffffffffffb8->size == 2) {
        iVar3 = handle_failure_message(in_R8,(mg_message_failure *)in_R9);
        iVar1 = handle_failure(in_stack_ffffffffffffffa8);
        if (iVar1 == 0) {
          mg_message_destroy_ca
                    ((mg_message *)CONCAT44(iVar3,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
          return iVar3;
        }
      }
      else {
        iVar1 = -10;
        mg_message_destroy_ca
                  ((mg_message *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98);
        mg_session_set_error(in_RDI,"unexpected message type");
      }
    }
  }
LAB_001064b0:
  mg_session_invalidate((mg_session *)0x1064ba);
  return iVar1;
}

Assistant:

int mg_session_run(mg_session *session, const char *query, const mg_map *params,
                   const mg_map *extra_run_information, const mg_list **columns,
                   int64_t *qid) {
  if (session->status == MG_SESSION_BAD) {
    mg_session_set_error(session, "bad session");
    return MG_ERROR_BAD_CALL;
  }
  if (!session->explicit_transaction &&
      session->status == MG_SESSION_EXECUTING) {
    mg_session_set_error(session, "already executing a query");
    return MG_ERROR_BAD_CALL;
  }
  if (session->status == MG_SESSION_FETCHING) {
    mg_session_set_error(session, "fetching results of a query");
    return MG_ERROR_BAD_CALL;
  }

  assert(session->status == MG_SESSION_READY ||
         (session->version == 4 && session->explicit_transaction &&
          session->status == MG_SESSION_EXECUTING));

  mg_message_destroy_ca(session->result.message, session->decoder_allocator);
  session->result.message = NULL;
  mg_list_destroy_ca(session->result.columns, session->allocator);
  session->result.columns = NULL;

  if (!params) {
    params = &mg_empty_map;
  }

  // extra field allowed only allowed for Auto-commit Transaction
  // TODO(aandelic): Check if sending extra run information while in Explicit
  // Transaction should result with an error
  if (session->version == 4 &&
      (!extra_run_information || session->explicit_transaction)) {
    extra_run_information = &mg_empty_map;
  }

  int status = 0;
  status = mg_session_send_run_message(session, query, params,
                                       extra_run_information);
  if (status != 0) {
    goto fatal_failure;
  }

  mg_transport_suspend_until_ready_to_read(session->transport);
  status = mg_session_receive_message(session);
  if (status != 0) {
    goto fatal_failure;
  }

  mg_message *response;

  status = mg_session_read_bolt_message(session, &response);
  if (status != 0) {
    goto fatal_failure;
  }

  if (response->type == MG_MESSAGE_TYPE_SUCCESS) {
    const mg_value *columns_tmp =
        mg_map_at(response->success_v->metadata, "fields");
    if (!columns_tmp || mg_value_get_type(columns_tmp) != MG_VALUE_TYPE_LIST) {
      status = MG_ERROR_PROTOCOL_VIOLATION;
      mg_message_destroy_ca(response, session->decoder_allocator);
      mg_session_set_error(session, "invalid response metadata");
      goto fatal_failure;
    }
    session->result.columns =
        mg_list_copy_ca(mg_value_list(columns_tmp), session->allocator);
    mg_message_destroy_ca(response, session->decoder_allocator);
    if (!session->result.columns) {
      mg_session_set_error(session, "out of memory");
      return MG_ERROR_OOM;
    }

    if (session->version == 4 && session->explicit_transaction) {
      if (qid) {
        const mg_value *qid_tmp =
            mg_map_at(response->success_v->metadata, "qid");

        if (!qid_tmp || mg_value_get_type(qid_tmp) != MG_VALUE_TYPE_INTEGER) {
          status = MG_ERROR_PROTOCOL_VIOLATION;
          mg_message_destroy_ca(response, session->decoder_allocator);
          mg_session_set_error(session, "invalid response metadata");
          goto fatal_failure;
        }

        *qid = mg_value_integer(qid_tmp);
      }

      ++session->query_number;
    }

    if (columns) {
      *columns = session->result.columns;
    }

    session->status = MG_SESSION_EXECUTING;
    return 0;
  }

  if (response->type == MG_MESSAGE_TYPE_FAILURE) {
    int failure_status = handle_failure_message(session, response->failure_v);

    status = handle_failure(session);
    if (status != 0) {
      goto fatal_failure;
    }

    mg_message_destroy_ca(response, session->decoder_allocator);
    return failure_status;
  }

  status = MG_ERROR_PROTOCOL_VIOLATION;
  mg_message_destroy_ca(response, session->decoder_allocator);
  mg_session_set_error(session, "unexpected message type");

fatal_failure:
  mg_session_invalidate(session);
  assert(status != 0);
  return status;
}